

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O1

void __thiscall
oout::SuiteTest::
SuiteTest<ContainMatchTest,ContainTestTest,CountErrorTest,CountFailureTest,CountTestTest,CtorExceptionTextTest,DirtyTestTest,EndsWithMatchTest,EndsWithTestTest,FunctionTextTest,GtestReportTextTest,MatchTestTest,MethodExceptionTextTest,NamedTestTest,OoutReportTextTest,PrintableTextTest,RegexMatchTest,RegexTestTest,SafeTestTest,SkippedTestTest,StartsWithMatchTest,StartsWithTestTest,SuiteTestTest,XmlReportTextTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<ContainMatchTest> *tests,
          shared_ptr<ContainTestTest> *tests_1,shared_ptr<CountErrorTest> *tests_2,
          shared_ptr<CountFailureTest> *tests_3,shared_ptr<CountTestTest> *tests_4,
          shared_ptr<CtorExceptionTextTest> *tests_5,shared_ptr<DirtyTestTest> *tests_6,
          shared_ptr<EndsWithMatchTest> *tests_7,shared_ptr<EndsWithTestTest> *tests_8,
          shared_ptr<FunctionTextTest> *tests_9,shared_ptr<GtestReportTextTest> *tests_10,
          shared_ptr<MatchTestTest> *tests_11,shared_ptr<MethodExceptionTextTest> *tests_12,
          shared_ptr<NamedTestTest> *tests_13,shared_ptr<OoutReportTextTest> *tests_14,
          shared_ptr<PrintableTextTest> *tests_15,shared_ptr<RegexMatchTest> *tests_16,
          shared_ptr<RegexTestTest> *tests_17,shared_ptr<SafeTestTest> *tests_18,
          shared_ptr<SkippedTestTest> *tests_19,shared_ptr<StartsWithMatchTest> *tests_20,
          shared_ptr<StartsWithTestTest> *tests_21,shared_ptr<SuiteTestTest> *tests_22,
          shared_ptr<XmlReportTextTest> *tests_23)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  allocator_type local_1b9;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_1b8;
  shared_ptr<const_oout::Test> local_1a0;
  element_type *local_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  element_type *local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  element_type *local_170;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  element_type *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  element_type *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  element_type *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  element_type *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  element_type *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  element_type *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  element_type *local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  element_type *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  element_type *local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  element_type *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  element_type *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  element_type *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1a0.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_190 = (tests->super___shared_ptr<ContainMatchTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_188 = (tests->super___shared_ptr<ContainMatchTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_188->_M_use_count = local_188->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_188->_M_use_count = local_188->_M_use_count + 1;
    }
  }
  local_180 = (tests_1->super___shared_ptr<ContainTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_178 = (tests_1->super___shared_ptr<ContainTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
              ._M_pi;
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_178->_M_use_count = local_178->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_178->_M_use_count = local_178->_M_use_count + 1;
    }
  }
  local_170 = (tests_2->super___shared_ptr<CountErrorTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_168 = (tests_2->super___shared_ptr<CountErrorTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
  if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_168->_M_use_count = local_168->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_168->_M_use_count = local_168->_M_use_count + 1;
    }
  }
  local_160 = (tests_3->super___shared_ptr<CountFailureTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_158 = (tests_3->super___shared_ptr<CountFailureTest,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_158->_M_use_count = local_158->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_158->_M_use_count = local_158->_M_use_count + 1;
    }
  }
  local_150 = (tests_4->super___shared_ptr<CountTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148 = (tests_4->super___shared_ptr<CountTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
  if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_148->_M_use_count = local_148->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_148->_M_use_count = local_148->_M_use_count + 1;
    }
  }
  local_140 = (tests_5->super___shared_ptr<CtorExceptionTextTest,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  local_138 = (tests_5->super___shared_ptr<CtorExceptionTextTest,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_138->_M_use_count = local_138->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_138->_M_use_count = local_138->_M_use_count + 1;
    }
  }
  local_130 = (tests_6->super___shared_ptr<DirtyTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_128 = (tests_6->super___shared_ptr<DirtyTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_128->_M_use_count = local_128->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_128->_M_use_count = local_128->_M_use_count + 1;
    }
  }
  local_120 = (tests_7->super___shared_ptr<EndsWithMatchTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_118 = (tests_7->super___shared_ptr<EndsWithMatchTest,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_118->_M_use_count = local_118->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_118->_M_use_count = local_118->_M_use_count + 1;
    }
  }
  local_110 = (tests_8->super___shared_ptr<EndsWithTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_108 = (tests_8->super___shared_ptr<EndsWithTestTest,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_108->_M_use_count = local_108->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_108->_M_use_count = local_108->_M_use_count + 1;
    }
  }
  local_100 = (tests_9->super___shared_ptr<FunctionTextTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_f8 = (tests_9->super___shared_ptr<FunctionTextTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_f8->_M_use_count = local_f8->_M_use_count + 1;
    }
  }
  local_f0 = (tests_10->super___shared_ptr<GtestReportTextTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e8 = (tests_10->super___shared_ptr<GtestReportTextTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_e8->_M_use_count = local_e8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_e8->_M_use_count = local_e8->_M_use_count + 1;
    }
  }
  local_e0 = (tests_11->super___shared_ptr<MatchTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8 = (tests_11->super___shared_ptr<MatchTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_d8->_M_use_count = local_d8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_d8->_M_use_count = local_d8->_M_use_count + 1;
    }
  }
  local_d0 = (tests_12->super___shared_ptr<MethodExceptionTextTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_c8 = (tests_12->super___shared_ptr<MethodExceptionTextTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_c8->_M_use_count = local_c8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_c8->_M_use_count = local_c8->_M_use_count + 1;
    }
  }
  local_c0 = (tests_13->super___shared_ptr<NamedTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_b8 = (tests_13->super___shared_ptr<NamedTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_b8->_M_use_count = local_b8->_M_use_count + 1;
    }
  }
  local_b0 = (tests_14->super___shared_ptr<OoutReportTextTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8 = (tests_14->super___shared_ptr<OoutReportTextTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_a8->_M_use_count = local_a8->_M_use_count + 1;
    }
  }
  local_a0 = (tests_15->super___shared_ptr<PrintableTextTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98 = (tests_15->super___shared_ptr<PrintableTextTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_98->_M_use_count = local_98->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_98->_M_use_count = local_98->_M_use_count + 1;
    }
  }
  local_90 = (tests_16->super___shared_ptr<RegexMatchTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88 = (tests_16->super___shared_ptr<RegexMatchTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_88->_M_use_count = local_88->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_88->_M_use_count = local_88->_M_use_count + 1;
    }
  }
  local_80 = (tests_17->super___shared_ptr<RegexTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_78 = (tests_17->super___shared_ptr<RegexTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_78->_M_use_count = local_78->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_78->_M_use_count = local_78->_M_use_count + 1;
    }
  }
  local_70 = (tests_18->super___shared_ptr<SafeTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68 = (tests_18->super___shared_ptr<SafeTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_68->_M_use_count = local_68->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_68->_M_use_count = local_68->_M_use_count + 1;
    }
  }
  local_60 = (tests_19->super___shared_ptr<SkippedTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58 = (tests_19->super___shared_ptr<SkippedTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  local_50 = (tests_20->super___shared_ptr<StartsWithMatchTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = (tests_20->super___shared_ptr<StartsWithMatchTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  local_40 = (tests_21->super___shared_ptr<StartsWithTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (tests_21->super___shared_ptr<StartsWithTestTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  local_30 = (tests_22->super___shared_ptr<SuiteTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (tests_22->super___shared_ptr<SuiteTestTest,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  local_20 = (tests_23->super___shared_ptr<XmlReportTextTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18 = (tests_23->super___shared_ptr<XmlReportTextTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  __l._M_len = 0x19;
  __l._M_array = &local_1a0;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_1b8,__l,&local_1b9);
  SuiteTest(this,(list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                  *)&local_1b8);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_1b8);
  lVar1 = 400;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_1b8._M_impl._M_node._M_size + lVar1);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}